

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelFillsElement::~IfcRelFillsElement(IfcRelFillsElement *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  bool *pbVar3;
  
  this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name.ptr._M_dataplus._M_p =
       (pointer)0x84b100;
  *(undefined8 *)
   &(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x20 = 0x84b128;
  puVar1 = *(undefined1 **)
            &this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.field_0x98;
  puVar2 = &this[-1].super_IfcRelConnects.super_IfcRelationship.field_0xa8;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  puVar2 = (undefined1 *)
           this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Description.ptr.field_2
           ._M_allocated_capacity;
  pbVar3 = &this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Description.have;
  if ((bool *)puVar2 != pbVar3) {
    operator_delete(puVar2,*(long *)pbVar3 + 1);
  }
  puVar2 = (undefined1 *)
           this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name.ptr.field_2.
           _M_allocated_capacity;
  pbVar3 = &this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name.have;
  if ((bool *)puVar2 != pbVar3) {
    operator_delete(puVar2,*(long *)pbVar3 + 1);
  }
  operator_delete(&this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name,0xe0);
  return;
}

Assistant:

IfcRelFillsElement() : Object("IfcRelFillsElement") {}